

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

void Image_Function::LookupTable
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *table)

{
  uint uVar1;
  uint uVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar3;
  ImageTemplate<unsigned_char> *image;
  ImageTemplate<unsigned_char> *image_00;
  byte bVar4;
  imageException *this;
  uchar *puVar5;
  uchar *puVar6;
  ulong uVar7;
  undefined4 in_register_0000008c;
  uchar *puVar8;
  uint local_78;
  uint local_74;
  ImageTemplate<unsigned_char> *local_70;
  ImageTemplate<unsigned_char> *local_68;
  undefined8 local_60;
  ImageTemplate<unsigned_char> local_58;
  
  pvVar3 = table;
  local_60 = CONCAT44(in_register_0000008c,startYOut);
  local_70 = out;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  image = local_70;
  if ((long)(pvVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(pvVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start == 0x100) {
    local_68 = in;
    bVar4 = CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>(in,local_70);
    image_00 = local_68;
    local_74 = (uint)bVar4;
    local_78 = width * local_74;
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_58,image);
    OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
              (&local_78,&height,image_00,&local_58);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_58);
    uVar1 = image_00->_rowSize;
    uVar2 = local_70->_rowSize;
    puVar8 = image_00->_data + (ulong)(startXIn * local_74) + (ulong)(startYIn * uVar1);
    puVar6 = local_70->_data + (ulong)(startXOut * local_74) + (ulong)((int)local_60 * uVar2);
    puVar5 = puVar6 + height * uVar2;
    for (; puVar6 != puVar5; puVar6 = puVar6 + uVar2) {
      for (uVar7 = 0; local_78 != uVar7; uVar7 = uVar7 + 1) {
        puVar6[uVar7] =
             (pvVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start[puVar8[uVar7]];
      }
      puVar8 = puVar8 + uVar1;
    }
    return;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this,"Lookup table size is not equal to 256");
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void LookupTable( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                      uint32_t width, uint32_t height, const std::vector < uint8_t > & table )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );

        if( table.size() != 256u )
            throw imageException( "Lookup table size is not equal to 256" );

        const uint8_t colorCount = CommonColorCount( in, out );
        width = width * colorCount;

        OptimiseRoi( width, height, in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn  * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX  = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ++outX, ++inX )
                (*outX) = table[*inX];
        }
    }